

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O0

void __thiscall C3DFile::fillPointLabelMap(C3DFile *this)

{
  size_t sVar1;
  char *pcVar2;
  mapped_type *pmVar3;
  undefined1 local_128 [8];
  string label;
  string row;
  size_t j;
  size_t i;
  DataMatrix<char> data_matrix;
  ParameterInfo local_b0;
  undefined1 local_60 [8];
  ParameterInfo param_info;
  C3DFile *this_local;
  
  param_info._72_8_ = this;
  ParameterInfo::ParameterInfo((ParameterInfo *)local_60);
  getParamInfo(&local_b0,this,"POINT:LABELS");
  ParameterInfo::operator=((ParameterInfo *)local_60,&local_b0);
  ParameterInfo::~ParameterInfo(&local_b0);
  if (param_info.name._2_1_ != -1) {
    __assert_fail("param_info.data_type == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                  ,0x17e,"void C3DFile::fillPointLabelMap()");
  }
  if (param_info.name._3_1_ == '\x02') {
    DataMatrix<char>::DataMatrix
              ((DataMatrix<char> *)&i,(uint)*(byte *)(param_info._16_8_ + 1),
               (uint)*(byte *)param_info._16_8_);
    DataMatrix<char>::CopyFrom((DataMatrix<char> *)&i,(char *)param_info.dimensions);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->point_label);
    j = 0;
    while( true ) {
      sVar1 = DataMatrix<char>::GetRows((DataMatrix<char> *)&i);
      if (sVar1 <= j) break;
      std::__cxx11::string::string((string *)(label.field_2._M_local_buf + 8));
      row.field_2._8_8_ = 0;
      while( true ) {
        sVar1 = DataMatrix<char>::GetColumns((DataMatrix<char> *)&i);
        if (sVar1 <= (ulong)row.field_2._8_8_) break;
        pcVar2 = DataMatrix<char>::operator()((DataMatrix<char> *)&i,(uint)j,row.field_2._8_4_);
        std::__cxx11::string::operator+=((string *)(label.field_2._M_local_buf + 8),*pcVar2);
        row.field_2._8_8_ = row.field_2._8_8_ + 1;
      }
      std::__cxx11::string::find_last_not_of((char)(&label.field_2._M_allocated_capacity + 1),0x20);
      std::__cxx11::string::substr
                ((ulong)local_128,(ulong)(&label.field_2._M_allocated_capacity + 1));
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
               ::operator[](&this->label_point_map,(key_type *)local_128);
      *pmVar3 = (mapped_type)j;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->point_label,(value_type *)local_128);
      std::__cxx11::string::~string((string *)local_128);
      std::__cxx11::string::~string((string *)(label.field_2._M_local_buf + 8));
      j = j + 1;
    }
    DataMatrix<char>::~DataMatrix((DataMatrix<char> *)&i);
    ParameterInfo::~ParameterInfo((ParameterInfo *)local_60);
    return;
  }
  __assert_fail("param_info.n_dimensions == 2",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                ,0x17f,"void C3DFile::fillPointLabelMap()");
}

Assistant:

void C3DFile::fillPointLabelMap () {
	ParameterInfo param_info;
	param_info = getParamInfo ("POINT:LABELS");

	assert (param_info.data_type == -1);
	assert (param_info.n_dimensions == 2);

	// Warning: as column major is used, we have to switch row and column numbers!
	DataMatrix<char> data_matrix(
			static_cast<unsigned int>(param_info.dimensions[1]),
			static_cast<unsigned int>(param_info.dimensions[0])
			);

	data_matrix.CopyFrom(param_info.char_data);

  point_label.clear();

	size_t i,j;
	for (i = 0; i < data_matrix.GetRows(); i++) {
		std::string row;
		for (j = 0; j < data_matrix.GetColumns(); j++) {
			row += data_matrix(i,j);
		}
		std::string label = row.substr(0, row.find_last_not_of(' ') + 1);

    label_point_map[label] = i;
    point_label.push_back(label);
	}
}